

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

string * __thiscall
helics::CoreBroker::quickBrokerQueries_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view request)

{
  value_t vVar1;
  BrokerState BVar2;
  json_value jVar3;
  pointer pcVar4;
  undefined8 uVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string *psVar10;
  int *__s1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t __n;
  char *pcVar13;
  char *pcVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  string_view fmt;
  format_args args;
  json base;
  string_t local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  data local_68;
  data local_50;
  data local_40;
  
  __s1 = (int *)request._M_str;
  __n = request._M_len;
  switch(__n) {
  case 4:
    pcVar13 = "name";
    break;
  default:
    goto switchD_0033c571_caseD_5;
  case 6:
    if ((short)__s1[1] == 0x7469 && *__s1 == 0x6e697369) {
      BVar2 = (this->super_BrokerBase).brokerState._M_i;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (BVar2 < OPERATING) {
LAB_0033c95f:
        pcVar14 = "false";
        pcVar13 = "";
        goto LAB_0033ca8a;
      }
    }
    else {
      iVar6 = bcmp(__s1,"exists",__n);
      if (iVar6 != 0) {
        iVar6 = bcmp(__s1,"status",__n);
        if (iVar6 == 0) {
          local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffffffffff00;
          local_b8._M_string_length = 0;
          BrokerBase::addBaseInformation
                    (&this->super_BrokerBase,(json *)&local_b8,
                     (bool)((this->super_BrokerBase).field_0x294 ^ 1));
          psVar10 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_50,psVar10);
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_b8,"state");
          vVar1 = (pvVar8->m_data).m_type;
          (pvVar8->m_data).m_type = local_50.m_type;
          jVar3 = (pvVar8->m_data).m_value;
          (pvVar8->m_data).m_value = local_50.m_value;
          local_50.m_type = vVar1;
          local_50.m_value = jVar3;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_50);
          local_68.m_type = null;
          local_68._1_7_ = 0;
          local_68.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_68,
                     (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7);
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_b8,"status");
          vVar1 = (pvVar8->m_data).m_type;
          (pvVar8->m_data).m_type = local_68.m_type;
          local_68.m_type = vVar1;
          jVar3 = (pvVar8->m_data).m_value;
          (pvVar8->m_data).m_value.object = (object_t *)local_68.m_value;
          local_68.m_value = jVar3;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_68);
          fileops::generateJsonString((string *)__return_storage_ptr__,(json *)&local_b8,true);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_b8);
          return __return_storage_ptr__;
        }
        goto switchD_0033c571_caseD_5;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    goto LAB_0033ca7c;
  case 7:
    iVar6 = bcmp(__s1,"queries",__n);
    if (iVar6 == 0) {
LAB_0033c62b:
      local_70 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
      __return_storage_ptr__->_M_string_length = 1;
      if (querySet_abi_cxx11_._24_8_ != 0x5804a8) {
        p_Var7 = (_Rb_tree_node_base *)querySet_abi_cxx11_._24_8_;
        do {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,*(long *)(p_Var7 + 1),
                     (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_40,&local_90);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_b8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_40);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(__return_storage_ptr__,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,',');
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)(querySet_abi_cxx11_ + 8));
        if (1 < __return_storage_ptr__->_M_string_length) {
          (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] =
               ']';
          return __return_storage_ptr__;
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,']');
      return __return_storage_ptr__;
    }
    iVar6 = bcmp(__s1,"address",__n);
    if (iVar6 != 0) {
      if (*(int *)((long)__s1 + 3) != 0x6e6f6973 || *__s1 != 0x73726576) {
        if (*(int *)((long)__s1 + 3) == 0x7265746e && *__s1 == 0x6e756f63) {
          iVar6 = generateMapObjectCounter(this);
          local_b8._M_dataplus._M_p._0_4_ = iVar6;
          fmt.size_ = 1;
          fmt.data_ = (char *)0x2;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&local_b8;
          ::fmt::v11::vformat_abi_cxx11_((string *)__return_storage_ptr__,(v11 *)0x44612e,fmt,args);
          return __return_storage_ptr__;
        }
        goto switchD_0033c571_caseD_5;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_90,"3.6.1 (2025-02-24)");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar9->_M_dataplus)._M_p;
      paVar11 = &pbVar9->field_2;
      if (paVar12 == paVar11) {
        local_b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_b8._M_dataplus._M_p = (pointer)paVar12;
      }
      local_b8._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      std::operator+(__return_storage_ptr__,&local_b8,'\"');
      goto LAB_0033c9e5;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
    psVar10 = getAddress_abi_cxx11_(this);
    std::operator+(&local_b8,&local_90,psVar10);
    std::operator+(__return_storage_ptr__,&local_b8,'\"');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_0033c9fb;
    goto LAB_0033c9ee;
  case 10:
    pcVar13 = "identifier";
    break;
  case 0xb:
    iVar6 = bcmp(__s1,"isconnected",__n);
    if (iVar6 != 0) goto switchD_0033c571_caseD_5;
    BVar2 = (this->super_BrokerBase).brokerState._M_i;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (6 < (ushort)(BVar2 + CONNECTED_ERROR)) goto LAB_0033c95f;
LAB_0033ca7c:
    pcVar14 = "true";
    pcVar13 = "";
LAB_0033ca8a:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar14,pcVar13);
    return __return_storage_ptr__;
  case 0x11:
    iVar6 = bcmp(__s1,"available_queries",__n);
    if (iVar6 == 0) goto LAB_0033c62b;
    goto switchD_0033c571_caseD_5;
  }
  iVar6 = bcmp(__s1,pcVar13,__n);
  if (iVar6 == 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
    pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_90,(this->super_BrokerBase).identifier._M_dataplus._M_p,
                       (this->super_BrokerBase).identifier._M_string_length);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar9->_M_dataplus)._M_p;
    paVar11 = &pbVar9->field_2;
    if (paVar12 == paVar11) {
      local_b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_b8._M_dataplus._M_p = (pointer)paVar12;
    }
    local_b8._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace_aux(&local_b8,local_b8._M_string_length,0,1,'\"');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (pbVar9->_M_dataplus)._M_p;
    paVar12 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar12) {
      uVar5 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
LAB_0033c9e5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0033c9ee:
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
LAB_0033c9fb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
switchD_0033c571_caseD_5:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::quickBrokerQueries(std::string_view request) const
{
    if (request == "isinit") {
        return (getBrokerState() >= BrokerState::OPERATING) ? std::string("true") :
                                                              std::string("false");
    }
    if (request == "isconnected") {
        return (isConnected()) ? std::string("true") : std::string("false");
    }
    if (request == "name" || request == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (request == "exists") {
        return "true";
    }
    if ((request == "queries") || (request == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (request == "address") {
        return std::string{"\""} + getAddress() + '"';
    }
    if (request == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (request == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (request == "status") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        return fileops::generateJsonString(base);
    }
    return {};
}